

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

void gl4cts::MultiBind::fillMSTexture(Context *context,GLuint texture_id,GLuint value,bool is_array)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  char *pcVar4;
  allocator<char> local_192;
  allocator<char> local_191;
  allocator<char> local_190;
  allocator<char> local_18f;
  allocator<char> local_18e;
  allocator<char> local_18d;
  GLuint local_18c;
  size_t position;
  Program program;
  string source;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  long lVar3;
  
  local_18c = value;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  position = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,
             "#version 430 core\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (location = 0) writeonly uniform IMAGE uni_image;\n\nlayout (location = 1) uniform uint uni_value;\n\nvoid main()\n{\n    const POINT;\n\n    imageStore(uni_image, point, 0, uvec4(uni_value, 0, 0, 0));\n}\n\n"
             ,(allocator<char> *)&program);
  pcVar4 = "layout(rgba8ui) uniform uimage2DMS";
  if ((int)CONCAT71(in_register_00000009,is_array) != 0) {
    pcVar4 = "layout(rgba8ui) uniform uimage2DMSArray";
  }
  replaceToken("IMAGE",&position,pcVar4 + 0x18,&source);
  pcVar4 = "ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y)";
  if (is_array) {
    pcVar4 = "ivec3 point = ivec3(gl_WorkGroupID.x, gl_WorkGroupID.y, 0)";
  }
  replaceToken("POINT",&position,pcVar4,&source);
  program.m_id = 0;
  program.m_compute.m_id = 0;
  program.m_fragment.m_id = 0;
  program.m_geometry.m_id = 0;
  program.m_tess_ctrl.m_id = 0;
  program.m_tess_eval.m_id = 0;
  program.m_vertex.m_id = 0;
  program.m_compute.m_context = context;
  program.m_fragment.m_context = context;
  program.m_geometry.m_context = context;
  program.m_tess_ctrl.m_context = context;
  program.m_tess_eval.m_context = context;
  program.m_vertex.m_context = context;
  program.m_context = context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,source._M_dataplus._M_p,&local_18d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,glcts::fixed_sample_locations_values + 1,&local_18e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,glcts::fixed_sample_locations_values + 1,&local_18f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,glcts::fixed_sample_locations_values + 1,&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,glcts::fixed_sample_locations_values + 1,&local_191);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_192);
  Program::Init(&program,&local_70,&local_90,&local_b0,&local_d0,&local_f0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  Program::Use(&program);
  (**(code **)(lVar3 + 0x80))(0,texture_id,0,is_array,0,0x88b9,0x8236);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x605);
  (**(code **)(lVar3 + 0x14f0))(0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x608);
  (**(code **)(lVar3 + 0x1500))(1,local_18c);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Uniform1ui",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x60b);
  (**(code **)(lVar3 + 0x528))(6,6,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"DispatchCompute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x60f);
  Program::~Program(&program);
  std::__cxx11::string::~string((string *)&source);
  return;
}

Assistant:

void fillMSTexture(deqp::Context& context, GLuint texture_id, GLuint value, bool is_array)
{
	/* */
	static const GLchar* cs = "#version 430 core\n"
							  "\n"
							  "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							  "\n"
							  "layout (location = 0) writeonly uniform IMAGE uni_image;\n"
							  "\n"
							  "layout (location = 1) uniform uint uni_value;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    const POINT;\n"
							  "\n"
							  "    imageStore(uni_image, point, 0, uvec4(uni_value, 0, 0, 0));\n"
							  "}\n"
							  "\n";

	static const GLchar* array_image   = "uimage2DMSArray";
	static const GLchar* array_point   = "ivec3 point = ivec3(gl_WorkGroupID.x, gl_WorkGroupID.y, 0)";
	static const GLchar* regular_image = "uimage2DMS";
	static const GLchar* regular_point = "ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y)";

	/* */
	const Functions& gl		  = context.getRenderContext().getFunctions();
	const GLchar*	image	= (true == is_array) ? array_image : regular_image;
	const GLchar*	point	= (true == is_array) ? array_point : regular_point;
	size_t			 position = 0;
	std::string		 source   = cs;

	/* */
	replaceToken("IMAGE", position, image, source);
	replaceToken("POINT", position, point, source);

	/* */
	Program program(context);
	program.Init(source.c_str(), "", "", "", "", "");
	program.Use();

	/* */
	if (true == is_array)
	{
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_TRUE /* layered */, 0 /* layer */,
							GL_WRITE_ONLY, GL_R32UI);
	}
	else
	{
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
							GL_WRITE_ONLY, GL_R32UI);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

	gl.uniform1i(0 /* location */, 0 /* image unit*/);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

	gl.uniform1ui(1 /* location */, value /* uni_value */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1ui");

	/* */
	gl.dispatchCompute(6, 6, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");
}